

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.h
# Opt level: O0

void __thiscall
kaitai::validation_expr_error<unsigned_int>::validation_expr_error
          (validation_expr_error<unsigned_int> *this,uint *actual,kstream *io,string *src_path)

{
  string *io_00;
  string local_80;
  allocator local_49;
  string local_48;
  string *local_28;
  string *src_path_local;
  kstream *io_local;
  uint *actual_local;
  validation_expr_error<unsigned_int> *this_local;
  
  local_28 = src_path;
  src_path_local = (string *)io;
  io_local = (kstream *)actual;
  actual_local = (uint *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"not matching the expression",&local_49);
  io_00 = src_path_local;
  std::__cxx11::string::string((string *)&local_80,(string *)src_path);
  validation_failed_error::validation_failed_error
            (&this->super_validation_failed_error,&local_48,(kstream *)io_00,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  *(undefined ***)&(this->super_validation_failed_error).super_kstruct_error =
       &PTR__validation_expr_error_0026fd28;
  this->m_actual = (uint *)io_local;
  return;
}

Assistant:

validation_expr_error<T>(const T& actual, kstream* io, const std::string src_path):
        validation_failed_error("not matching the expression", io, src_path),
        m_actual(actual)
    {
    }